

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

QByteArray * __thiscall
QNetworkHeadersPrivate::rawHeader
          (QByteArray *__return_storage_ptr__,QNetworkHeadersPrivate *this,QAnyStringView headerName
          )

{
  int iVar1;
  qsizetype qVar2;
  char *s;
  QHttpHeaders *this_00;
  long i;
  QAnyStringView QVar3;
  QByteArrayView QVar4;
  QLatin1StringView QVar5;
  QAnyStringView QVar6;
  
  QVar4 = QHttpHeaders::wellKnownHeaderName(SetCookie);
  QVar6.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar4.m_data;
  QVar6.m_size = QVar4.m_size;
  iVar1 = QAnyStringView::compare(headerName,QVar6,CaseInsensitive);
  if (iVar1 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    this_00 = &this->httpHeaders;
    qVar2 = QHttpHeaders::size(this_00);
    if (0 < qVar2) {
      s = "";
      i = 0;
      do {
        QVar5 = QHttpHeaders::nameAt(this_00,i);
        QVar3.m_size = QVar5.m_size | 0x4000000000000000;
        QVar3.field_0.m_data_utf8 = QVar5.m_data;
        iVar1 = QAnyStringView::compare(QVar3,headerName,CaseInsensitive);
        if (iVar1 == 0) {
          QByteArray::append(__return_storage_ptr__,s,-1);
          QVar4 = QHttpHeaders::valueAt(this_00,i);
          QVar4.m_data = (storage_type *)QVar4.m_size;
          QVar4.m_size = (__return_storage_ptr__->d).size;
          QByteArray::insert((longlong)__return_storage_ptr__,QVar4);
          s = "\n";
        }
        i = i + 1;
        qVar2 = QHttpHeaders::size(this_00);
      } while (i < qVar2);
    }
  }
  else {
    QHttpHeaders::combinedValue(__return_storage_ptr__,&this->httpHeaders,headerName);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QNetworkHeadersPrivate::rawHeader(QAnyStringView headerName) const
{
    QByteArrayView setCookieStr = QHttpHeaders::wellKnownHeaderName(
            QHttpHeaders::WellKnownHeader::SetCookie);
    if (QAnyStringView::compare(headerName, setCookieStr, Qt::CaseInsensitive) != 0)
        return httpHeaders.combinedValue(headerName);

    QByteArray result;
    const char* separator = "";
    for (qsizetype i = 0; i < httpHeaders.size(); ++i) {
        if (QAnyStringView::compare(httpHeaders.nameAt(i), headerName, Qt::CaseInsensitive) == 0) {
            result.append(separator);
            result.append(httpHeaders.valueAt(i));
            separator = "\n";
        }
    }
    return result;
}